

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrSetInputDeviceLocationEXT
                   (XrSession session,XrPath topLevelPath,XrPath inputSourcePath,XrSpace space,
                   XrPosef pose)

{
  bool bVar1;
  ValidateXrHandleResult VVar2;
  ostream *poVar3;
  XrResult XVar4;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar5;
  XrSpace_T *in_stack_fffffffffffffd88;
  allocator local_26a;
  allocator local_269;
  string local_268;
  XrSpace space_local;
  XrSession session_local;
  string local_238;
  string local_218;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1a8;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 2;
  space_local = space;
  session_local = session;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&session_local,(XrObjectType *)&oss);
  VVar2 = VerifyXrSessionHandle(&session_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar5 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,session_local);
    _oss = 4;
    std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
    emplace_back<XrSpace_T*&,XrObjectType>
              ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
               &objects_info,&space_local,(XrObjectType *)&oss);
    VVar2 = VerifyXrSpaceHandle(&space_local);
    if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
      bVar1 = VerifyXrParent(XR_OBJECT_TYPE_SESSION,(uint64_t)session_local,XR_OBJECT_TYPE_SPACE,
                             (uint64_t)space_local,true);
      XVar4 = XR_SUCCESS;
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar3 = std::operator<<((ostream *)&oss,"XrSession ");
        HandleToHexString<XrSession_T*>((XrSession_T *)in_stack_fffffffffffffd88);
        std::operator<<(poVar3,(string *)&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::operator<<((ostream *)&oss," must be a parent to XrSpace ");
        HandleToHexString<XrSpace_T*>(in_stack_fffffffffffffd88);
        std::operator<<((ostream *)&oss,(string *)&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::string
                  ((string *)&local_268,"VUID-xrSetInputDeviceLocationEXT-space-parent",&local_269);
        std::__cxx11::string::string((string *)&local_218,"xrSetInputDeviceLocationEXT",&local_26a);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1d8,&objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(pVar5.second,&local_268,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_218,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_1d8,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_1d8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
        XVar4 = XR_ERROR_VALIDATION_FAILURE;
      }
      goto LAB_001d4720;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSpace handle \"space\" ");
    HandleToHexString<XrSpace_T*>(in_stack_fffffffffffffd88);
    std::operator<<((ostream *)&oss,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::string
              ((string *)&local_268,"VUID-xrSetInputDeviceLocationEXT-space-parameter",&local_269);
    std::__cxx11::string::string((string *)&local_218,"xrSetInputDeviceLocationEXT",&local_26a);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(pVar5.second,&local_268,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_218,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c0,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    this = &local_1c0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>((XrSession_T *)in_stack_fffffffffffffd88);
    std::operator<<((ostream *)&oss,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::string
              ((string *)&local_268,"VUID-xrSetInputDeviceLocationEXT-session-parameter",&local_269)
    ;
    std::__cxx11::string::string((string *)&local_218,"xrSetInputDeviceLocationEXT",&local_26a);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1a8,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_268,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_218,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1a8,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    this = &local_1a8;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  XVar4 = XR_ERROR_HANDLE_INVALID;
LAB_001d4720:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar4;
}

Assistant:

XrResult GenValidUsageInputsXrSetInputDeviceLocationEXT(
XrSession session,
XrPath topLevelPath,
XrPath inputSourcePath,
XrSpace space,
XrPosef pose) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrSetInputDeviceLocationEXT-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSetInputDeviceLocationEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        objects_info.emplace_back(space, XR_OBJECT_TYPE_SPACE);
        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&space);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSpace handle \"space\" ";
                oss << HandleToHexString(space);
                CoreValidLogMessage(gen_instance_info, "VUID-xrSetInputDeviceLocationEXT-space-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSetInputDeviceLocationEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        // Verify that the handles share a common ancestry
        if (!VerifyXrParent(XR_OBJECT_TYPE_SESSION,  MakeHandleGeneric(session),
                    XR_OBJECT_TYPE_SPACE,  MakeHandleGeneric(space), true)) {
            std::ostringstream oss_error;
            oss_error << "XrSession " << HandleToHexString(session);
            oss_error << " must be a parent to XrSpace ";
            oss_error << HandleToHexString(space);
            CoreValidLogMessage(gen_instance_info, "VUID-xrSetInputDeviceLocationEXT-space-parent",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSetInputDeviceLocationEXT",
                                objects_info, oss_error.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}